

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.hpp
# Opt level: O2

void mserialize::detail::
     BuiltinSerializer<std::shared_ptr<std::unique_ptr<int,_std::default_delete<int>_>_>,_void>::
     serialize<OutputStream>
               (shared_ptr<std::unique_ptr<int,_std::default_delete<int>_>_> *opt,
               OutputStream *ostream)

{
  if ((opt->
      super___shared_ptr<std::unique_ptr<int,_std::default_delete<int>_>,_(__gnu_cxx::_Lock_policy)2>
      )._M_ptr != (element_type *)0x0) {
    TrivialSerializer<unsigned_char>::serialize<OutputStream>('\x01',ostream);
    BuiltinSerializer<std::unique_ptr<int,_std::default_delete<int>_>,_void>::
    serialize<OutputStream>
              ((opt->
               super___shared_ptr<std::unique_ptr<int,_std::default_delete<int>_>,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr,ostream);
    return;
  }
  TrivialSerializer<unsigned_char>::serialize<OutputStream>('\0',ostream);
  return;
}

Assistant:

static void serialize(const Optional& opt, OutputStream& ostream)
  {
    if (opt)
    {
      mserialize::serialize(std::uint8_t{1}, ostream);
      mserialize::serialize(*opt, ostream);
    }
    else
    {
      mserialize::serialize(std::uint8_t{0}, ostream);
    }
  }